

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IndexedByLookup(Parse *pParse,SrcList_item *pFrom)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Index *pIVar4;
  long lVar5;
  
  iVar3 = 0;
  if ((pFrom->pTab != (Table *)0x0) && (((pFrom->fg).field_0x1 & 2) != 0)) {
    pIVar4 = pFrom->pTab->pIndex;
    if (pIVar4 != (Index *)0x0) {
LAB_0019d760:
      lVar5 = 0;
      do {
        bVar1 = pIVar4->zName[lVar5];
        bVar2 = (pFrom->u1).zIndexedBy[lVar5];
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) {
            pFrom->pIBIndex = pIVar4;
            return 0;
          }
        }
        else if (""[bVar1] != ""[bVar2]) goto LAB_0019d78b;
        lVar5 = lVar5 + 1;
      } while( true );
    }
LAB_0019d794:
    sqlite3ErrorMsg(pParse,"no such index: %s",(pFrom->u1).zIndexedBy,0);
    pParse->checkSchema = '\x01';
    iVar3 = 1;
  }
  return iVar3;
LAB_0019d78b:
  pIVar4 = pIVar4->pNext;
  if (pIVar4 == (Index *)0x0) goto LAB_0019d794;
  goto LAB_0019d760;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, struct SrcList_item *pFrom){
  if( pFrom->pTab && pFrom->fg.isIndexedBy ){
    Table *pTab = pFrom->pTab;
    char *zIndexedBy = pFrom->u1.zIndexedBy;
    Index *pIdx;
    for(pIdx=pTab->pIndex; 
        pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy); 
        pIdx=pIdx->pNext
    );
    if( !pIdx ){
      sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
      pParse->checkSchema = 1;
      return SQLITE_ERROR;
    }
    pFrom->pIBIndex = pIdx;
  }
  return SQLITE_OK;
}